

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O2

void __thiscall ProcessesView::onDataUpdated(ProcessesView *this)

{
  ProcessInfo *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QVector<ProcessInfo> *pQVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  int j;
  ulong uVar9;
  QString *pid_00;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  ProcessesView *local_88;
  long local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  QString pid;
  undefined1 local_48 [24];
  
  QTreeView::setSortingEnabled(SUB81(this,0));
  pQVar5 = InfoProvider::getProcesses();
  plVar6 = (long *)QAbstractItemView::model();
  local_a8._forAlignment = -NAN;
  local_a8._8_8_ = 0;
  local_a8._16_8_ = 0;
  iVar3 = (**(code **)(*plVar6 + 0x78))(plVar6);
  local_88 = this;
  do {
    if (iVar3 < 1) {
      plVar6 = (long *)QAbstractItemView::model();
      local_a8._forAlignment = -NAN;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = 0;
      iVar3 = (**(code **)(*plVar6 + 0x78))(plVar6,&local_a8);
      pPVar1 = (pQVar5->d).ptr;
      local_80 = (pQVar5->d).size * 0xd8;
      for (lVar8 = 0; local_80 != lVar8; lVar8 = lVar8 + 0xd8) {
        pid_00 = (QString *)((long)&(pPVar1->pid).d.d + lVar8);
        iVar4 = getRowIndexByPid(this,pid_00);
        if (iVar4 == -1) {
          QVariant::QVariant((QVariant *)&local_a8,(QString *)((long)&(pPVar1->name).d.d + lVar8));
          addItem(this,iVar3,0,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          QVariant::QVariant((QVariant *)&local_a8,(QString *)((long)&(pPVar1->type).d.d + lVar8));
          addItem(this,iVar3,1,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          convertToInt((QVariant *)&local_a8,(QString *)((long)&(pPVar1->gpuIdx).d.d + lVar8));
          addItem(this,iVar3,2,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          convertToInt((QVariant *)&local_a8,pid_00);
          addItem(this,iVar3,3,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          convertToInt((QVariant *)&local_a8,(QString *)((long)&(pPVar1->sm).d.d + lVar8));
          addItem(this,iVar3,5,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          convertToInt((QVariant *)&local_a8,(QString *)((long)&(pPVar1->mem).d.d + lVar8));
          addItem(this,iVar3,6,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          convertToInt((QVariant *)&local_a8,(QString *)((long)&(pPVar1->enc).d.d + lVar8));
          addItem(this,iVar3,7,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          convertToInt((QVariant *)&local_a8,(QString *)((long)&(pPVar1->dec).d.d + lVar8));
          addItem(this,iVar3,8,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          convertToInt((QVariant *)&local_a8,(QString *)((long)&(pPVar1->fbmem).d.d + lVar8));
          addItem(this,iVar3,4,(QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_a8);
          iVar3 = iVar3 + 1;
        }
      }
      QTreeView::setSortingEnabled(SUB81(this,0));
      return;
    }
    iVar3 = iVar3 + -1;
    plVar6 = (long *)QAbstractItemView::model();
    plVar7 = (long *)QAbstractItemView::model();
    local_78 = 0xffffffffffffffff;
    local_70 = 0;
    uStack_68 = 0;
    (**(code **)(*plVar7 + 0x60))(local_48,plVar7,iVar3,3,&local_78);
    (**(code **)(*plVar6 + 0x90))(&local_a8,plVar6,local_48,0);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&local_a8);
    lVar8 = 0x48;
    for (uVar9 = 0; this = local_88, (long)uVar9 < (pQVar5->d).size; uVar9 = uVar9 + 1) {
      bVar2 = operator==((QString *)((long)&(((pQVar5->d).ptr)->name).d.d + lVar8),(QString *)&pid.d
                        );
      if (bVar2) {
        uVar9 = uVar9 & 0xffffffff;
        pPVar1 = (pQVar5->d).ptr;
        QVariant::QVariant((QVariant *)&local_a8,(QString *)&pPVar1[uVar9].type);
        updateItem(local_88,iVar3,1,(QVariant *)&local_a8);
        QVariant::~QVariant((QVariant *)&local_a8);
        convertToInt((QVariant *)&local_a8,&pPVar1[uVar9].sm);
        this = local_88;
        updateItem(local_88,iVar3,5,(QVariant *)&local_a8);
        QVariant::~QVariant((QVariant *)&local_a8);
        convertToInt((QVariant *)&local_a8,&pPVar1[uVar9].mem);
        updateItem(this,iVar3,6,(QVariant *)&local_a8);
        QVariant::~QVariant((QVariant *)&local_a8);
        convertToInt((QVariant *)&local_a8,&pPVar1[uVar9].enc);
        updateItem(this,iVar3,7,(QVariant *)&local_a8);
        QVariant::~QVariant((QVariant *)&local_a8);
        convertToInt((QVariant *)&local_a8,&pPVar1[uVar9].dec);
        updateItem(this,iVar3,8,(QVariant *)&local_a8);
        QVariant::~QVariant((QVariant *)&local_a8);
        convertToInt((QVariant *)&local_a8,&pPVar1[uVar9].fbmem);
        updateItem(this,iVar3,4,(QVariant *)&local_a8);
        QVariant::~QVariant((QVariant *)&local_a8);
        goto LAB_001161e9;
      }
      lVar8 = lVar8 + 0xd8;
    }
    plVar6 = (long *)QAbstractItemView::model();
    local_a8._forAlignment = -NAN;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = 0;
    (**(code **)(*plVar6 + 0x108))(plVar6,iVar3,1);
LAB_001161e9:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&pid.d);
  } while( true );
}

Assistant:

void ProcessesView::onDataUpdated() {
    // In order to avoid performance and other issues, sorting will be enabled after inserting
    // and updating the items in the tree: https://doc.qt.io/qt-5/qtreeview.html#sortingEnabled-prop
    setSortingEnabled(false);

    const auto &processes = InfoProvider::getProcesses();

    // update existing processes list & remove finished processes
    // loop from more to less in order to delete rows
    for (int i = model()->rowCount() - 1; i >= 0; i--) {
        QString pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        int index = -1;

        for (int j = 0; j < processes.size(); ++j) {
            if (processes[j].pid == pid) {
                index = j;
                break;
            }
        }

        if (index == -1) {
            model()->removeRow(i);
        } else {
            const ProcessInfo &processInfo = processes[index];

            // update what may change
            updateItem(i, NVSMColumns::Type, processInfo.type);
            updateItem(i, NVSMColumns::Sm, convertToInt(processInfo.sm));
            updateItem(i, NVSMColumns::Mem, convertToInt(processInfo.mem));
            updateItem(i, NVSMColumns::Enc, convertToInt(processInfo.enc));
            updateItem(i, NVSMColumns::Dec, convertToInt(processInfo.dec));
            updateItem(i, NVSMColumns::FbMem, convertToInt(processInfo.fbmem));
        }
    }

    // add new processes to the list, if there are any
    int rowCount = model()->rowCount();
    for (auto &process : processes) {
        if (getRowIndexByPid(process.pid) == -1) {
            addItem(rowCount, NVSMColumns::Name, process.name);
            addItem(rowCount, NVSMColumns::Type, process.type);
            addItem(rowCount, NVSMColumns::GPUIdx, convertToInt(process.gpuIdx));
            addItem(rowCount, NVSMColumns::PID, convertToInt(process.pid));
            addItem(rowCount, NVSMColumns::Sm, convertToInt(process.sm));
            addItem(rowCount, NVSMColumns::Mem, convertToInt(process.mem));
            addItem(rowCount, NVSMColumns::Enc, convertToInt(process.enc));
            addItem(rowCount, NVSMColumns::Dec, convertToInt(process.dec));
            addItem(rowCount, NVSMColumns::FbMem, convertToInt(process.fbmem));

            rowCount++;
        }
    }

    setSortingEnabled(true);
}